

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_9(QPDF *pdf,char *arg2)

{
  char *pcVar1;
  QPDFWriter w;
  shared_ptr<Buffer> buf;
  QPDFObjectHandle rstream;
  QPDFObjectHandle qstream;
  QPDFObjectHandle root;
  QPDFObjectHandle local_b8;
  long local_a8 [2];
  Buffer *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  QPDF local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  Buffer *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  QPDF::getRoot();
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_b8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x14);
  local_98 = (Buffer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Buffer,std::allocator<Buffer>,unsigned_int>
            (&local_90,&local_98,(allocator<Buffer> *)local_68,(uint *)&local_b8);
  pcVar1 = (char *)Buffer::getBuffer();
  builtin_strncpy(pcVar1,"data for new stream\n",0x14);
  local_78 = local_98;
  local_70 = local_90._M_pi;
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
    }
  }
  QPDFObjectHandle::newStream(local_68,pdf,&local_78);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  QPDFObjectHandle::newStream(local_88);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_28);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- getStreamData didn\'t throw",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"data for other stream\n","");
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData((string *)local_88,&local_b8,&local_38);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_38.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_a8) {
    operator_delete(local_b8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_a8[0] + 1);
  }
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/QStream","");
  QPDFObjectHandle::replaceKey(local_58,&local_b8);
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_a8) {
    operator_delete(local_b8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_a8[0] + 1);
  }
  local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/RStream","");
  QPDFObjectHandle::replaceKey(local_58,&local_b8);
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)local_a8) {
    operator_delete(local_b8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_a8[0] + 1);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_b8,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&local_b8,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_b8);
  QPDFWriter::write();
  if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

static void
test_9(QPDF& pdf, char const* arg2)
{
    QPDFObjectHandle root = pdf.getRoot();
    // Explicitly exercise the Buffer version of newStream
    auto buf = std::make_shared<Buffer>(20U);
    unsigned char* bp = buf->getBuffer();
    memcpy(bp, "data for new stream\n", 20); // no null!
    QPDFObjectHandle qstream = QPDFObjectHandle::newStream(&pdf, buf);
    QPDFObjectHandle rstream = QPDFObjectHandle::newStream(&pdf);
    try {
        rstream.getStreamData();
        std::cout << "oops -- getStreamData didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "exception: " << e.what() << std::endl;
    }
    rstream.replaceStreamData(
        "data for other stream\n", QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    root.replaceKey("/QStream", qstream);
    root.replaceKey("/RStream", rstream);
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}